

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O2

void __thiscall
Eigen::internal::
product_evaluator<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_0>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
::product_evaluator(product_evaluator<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    *this,XprType *xpr)

{
  Index IVar1;
  Index local_30;
  Index local_28;
  
  (this->super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_data =
       (Scalar *)0x0;
  (this->super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_outerStride.
  m_value = -1;
  local_28 = (xpr->m_lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
             m_storage.m_rows;
  local_30 = (((xpr->m_rhs).m_matrix)->
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  Matrix<double,-1,-1,0,-1,-1>::Matrix<long,long>
            ((Matrix<double,_1,_1,0,_1,_1> *)&this->m_result,&local_28,&local_30);
  IVar1 = (this->m_result).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_rows;
  (this->super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_data =
       (this->m_result).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data;
  (this->super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_outerStride.
  m_value = IVar1;
  generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>const>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>(&this->m_result,xpr->m_lhs,&xpr->m_rhs);
  return;
}

Assistant:

explicit product_evaluator(const XprType& xpr)
    : m_result(xpr.rows(), xpr.cols())
  {
    ::new (static_cast<Base*>(this)) Base(m_result);
    
// FIXME shall we handle nested_eval here?,
// if so, then we must take care at removing the call to nested_eval in the specializations (e.g., in permutation_matrix_product, transposition_matrix_product, etc.)
//     typedef typename internal::nested_eval<Lhs,Rhs::ColsAtCompileTime>::type LhsNested;
//     typedef typename internal::nested_eval<Rhs,Lhs::RowsAtCompileTime>::type RhsNested;
//     typedef typename internal::remove_all<LhsNested>::type LhsNestedCleaned;
//     typedef typename internal::remove_all<RhsNested>::type RhsNestedCleaned;
//     
//     const LhsNested lhs(xpr.lhs());
//     const RhsNested rhs(xpr.rhs());
//   
//     generic_product_impl<LhsNestedCleaned, RhsNestedCleaned>::evalTo(m_result, lhs, rhs);

    generic_product_impl<Lhs, Rhs, LhsShape, RhsShape, ProductTag>::evalTo(m_result, xpr.lhs(), xpr.rhs());
  }